

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestSpecParser::visitChar(TestSpecParser *this,char c)

{
  bool bVar1;
  char c_local;
  TestSpecParser *this_local;
  
  if ((this->m_mode == EscapedName) || (c != '\\')) {
    if ((this->m_mode == EscapedName) || (c != ',')) {
      switch(this->m_mode) {
      case None:
        bVar1 = processNoneChar(this,c);
        if (bVar1) {
          return true;
        }
        break;
      case Name:
        processNameChar(this,c);
        break;
      default:
        bVar1 = processOtherChar(this,c);
        if (bVar1) {
          return true;
        }
        break;
      case EscapedName:
        endMode(this);
        addCharToPattern(this,c);
        return true;
      }
      std::__cxx11::string::operator+=((string *)&this->m_substring,c);
      bVar1 = isControlChar(this,c);
      if (!bVar1) {
        std::__cxx11::string::operator+=((string *)&this->m_patternName,c);
        this->m_realPatternPos = this->m_realPatternPos + 1;
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = separate(this);
    }
  }
  else {
    escape(this);
    addCharToPattern(this,'\\');
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool TestSpecParser::visitChar( char c ) {
        if( (m_mode != EscapedName) && (c == '\\') ) {
            escape();
            addCharToPattern(c);
            return true;
        }else if((m_mode != EscapedName) && (c == ',') )  {
            return separate();
        }

        switch( m_mode ) {
        case None:
            if( processNoneChar( c ) )
                return true;
            break;
        case Name:
            processNameChar( c );
            break;
        case EscapedName:
            endMode();
            addCharToPattern(c);
            return true;
        default:
        case Tag:
        case QuotedName:
            if( processOtherChar( c ) )
                return true;
            break;
        }

        m_substring += c;
        if( !isControlChar( c ) ) {
            m_patternName += c;
            m_realPatternPos++;
        }
        return true;
    }